

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

bool YAML::convert<bool>::decode(Node *node,bool *rhs)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  string *psVar6;
  InvalidNode *this;
  char *pcVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  string rest;
  char *local_58;
  ulong local_50;
  char local_48 [16];
  bool *local_38;
  
  bVar5 = Node::IsScalar(node);
  if (bVar5) {
    if ((decode(YAML::Node_const&,bool&)::names == '\0') &&
       (iVar8 = __cxa_guard_acquire(&decode(YAML::Node_const&,bool&)::names), iVar8 != 0)) {
      decode::names[0].truename._M_dataplus._M_p = (pointer)&decode::names[0].truename.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)decode::names,"y","");
      decode::names[0].falsename._M_dataplus._M_p = (pointer)&decode::names[0].falsename.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&decode::names[0].falsename,"n","");
      decode::names[1].truename._M_dataplus._M_p = (pointer)&decode::names[1].truename.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)(decode::names + 1),"yes","");
      decode::names[1].falsename._M_dataplus._M_p = (pointer)&decode::names[1].falsename.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&decode::names[1].falsename,"no","")
      ;
      decode::names[2].truename._M_dataplus._M_p = (pointer)&decode::names[2].truename.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)(decode::names + 2),"true","");
      decode::names[2].falsename._M_dataplus._M_p = (pointer)&decode::names[2].falsename.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&decode::names[2].falsename,"false","");
      decode::names[3].truename._M_dataplus._M_p = (pointer)&decode::names[3].truename.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)(decode::names + 3),"on","");
      decode::names[3].falsename._M_dataplus._M_p = (pointer)&decode::names[3].falsename.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&decode::names[3].falsename,"off","");
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&decode(YAML::Node_const&,bool&)::names);
    }
    if (node->m_isValid == false) {
      this = (InvalidNode *)__cxa_allocate_exception(0x40);
      InvalidNode::InvalidNode(this,&node->m_invalidKey);
LAB_0071331b:
      __cxa_throw(this,&InvalidNode::typeinfo,BadFile::~BadFile);
    }
    if (node->m_pNode == (node *)0x0) {
      psVar6 = detail::node_data::empty_scalar_abi_cxx11_();
    }
    else {
      psVar6 = &((((node->m_pNode->m_pRef).
                   super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_scalar;
    }
    uVar3 = psVar6->_M_string_length;
    if (uVar3 != 0) {
      pcVar10 = (psVar6->_M_dataplus)._M_p;
      pcVar1 = pcVar10 + uVar3;
      pcVar7 = pcVar10;
      if (0 < (long)uVar3 >> 2) {
        pcVar7 = pcVar10 + (uVar3 & 0xfffffffffffffffc);
        lVar11 = ((long)uVar3 >> 2) + 1;
        pcVar9 = pcVar10 + 3;
        do {
          if (0x19 < (byte)(pcVar9[-3] + 0x9fU)) {
            pcVar9 = pcVar9 + -3;
            goto LAB_00712fac;
          }
          if (0x19 < (byte)(pcVar9[-2] + 0x9fU)) {
            pcVar9 = pcVar9 + -2;
            goto LAB_00712fac;
          }
          if (0x19 < (byte)(pcVar9[-1] + 0x9fU)) {
            pcVar9 = pcVar9 + -1;
            goto LAB_00712fac;
          }
          if (0x19 < (byte)(*pcVar9 + 0x9fU)) goto LAB_00712fac;
          lVar11 = lVar11 + -1;
          pcVar9 = pcVar9 + 4;
        } while (1 < lVar11);
      }
      lVar11 = (long)pcVar1 - (long)pcVar7;
      if (lVar11 == 1) {
LAB_00712f89:
        pcVar9 = pcVar7;
        if ((byte)(*pcVar7 + 0x9fU) < 0x1a) {
          pcVar9 = pcVar1;
        }
      }
      else if (lVar11 == 2) {
LAB_00712f79:
        pcVar9 = pcVar7;
        if ((byte)(*pcVar7 + 0x9fU) < 0x1a) {
          pcVar7 = pcVar7 + 1;
          goto LAB_00712f89;
        }
      }
      else {
        pcVar9 = pcVar1;
        if ((lVar11 == 3) && (pcVar9 = pcVar7, (byte)(*pcVar7 + 0x9fU) < 0x1a)) {
          pcVar7 = pcVar7 + 1;
          goto LAB_00712f79;
        }
      }
LAB_00712fac:
      if (pcVar9 != pcVar1) {
        cVar2 = *pcVar10;
        std::__cxx11::string::substr((ulong)&local_58,(ulong)psVar6);
        if ((byte)(cVar2 + 0xbfU) < 0x1a) {
          pcVar1 = local_58 + local_50;
          lVar11 = (long)local_50 >> 2;
          pcVar10 = local_58;
          if (0 < lVar11) {
            pcVar10 = local_58 + (local_50 & 0xfffffffffffffffc);
            lVar12 = lVar11 + 1;
            pcVar7 = local_58 + 3;
            do {
              if (0x19 < (byte)(pcVar7[-3] + 0x9fU)) {
                pcVar7 = pcVar7 + -3;
                goto LAB_007130c7;
              }
              if (0x19 < (byte)(pcVar7[-2] + 0x9fU)) {
                pcVar7 = pcVar7 + -2;
                goto LAB_007130c7;
              }
              if (0x19 < (byte)(pcVar7[-1] + 0x9fU)) {
                pcVar7 = pcVar7 + -1;
                goto LAB_007130c7;
              }
              if (0x19 < (byte)(*pcVar7 + 0x9fU)) goto LAB_007130c7;
              lVar12 = lVar12 + -1;
              pcVar7 = pcVar7 + 4;
            } while (1 < lVar12);
          }
          lVar12 = (long)pcVar1 - (long)pcVar10;
          if (lVar12 == 1) {
LAB_00713098:
            pcVar7 = pcVar10;
            if ((byte)(*pcVar10 + 0x9fU) < 0x1a) {
              pcVar7 = pcVar1;
            }
          }
          else if (lVar12 == 2) {
LAB_00713088:
            pcVar7 = pcVar10;
            if ((byte)(*pcVar10 + 0x9fU) < 0x1a) {
              pcVar10 = pcVar10 + 1;
              goto LAB_00713098;
            }
          }
          else {
            pcVar7 = pcVar1;
            if ((lVar12 == 3) && (pcVar7 = pcVar10, (byte)(*pcVar10 + 0x9fU) < 0x1a)) {
              pcVar10 = pcVar10 + 1;
              goto LAB_00713088;
            }
          }
LAB_007130c7:
          if (pcVar7 == pcVar1) {
            bVar5 = true;
          }
          else {
            pcVar10 = local_58;
            if (0 < lVar11) {
              pcVar10 = local_58 + (local_50 & 0xfffffffffffffffc);
              lVar11 = lVar11 + 1;
              pcVar7 = local_58 + 3;
              do {
                if (0x19 < (byte)(pcVar7[-3] + 0xbfU)) {
                  pcVar7 = pcVar7 + -3;
                  goto LAB_0071317b;
                }
                if (0x19 < (byte)(pcVar7[-2] + 0xbfU)) {
                  pcVar7 = pcVar7 + -2;
                  goto LAB_0071317b;
                }
                if (0x19 < (byte)(pcVar7[-1] + 0xbfU)) {
                  pcVar7 = pcVar7 + -1;
                  goto LAB_0071317b;
                }
                if (0x19 < (byte)(*pcVar7 + 0xbfU)) goto LAB_0071317b;
                lVar11 = lVar11 + -1;
                pcVar7 = pcVar7 + 4;
              } while (1 < lVar11);
            }
            lVar11 = (long)pcVar1 - (long)pcVar10;
            if (lVar11 == 1) {
LAB_00713156:
              pcVar7 = pcVar10;
              if ((byte)(*pcVar10 + 0xbfU) < 0x1a) {
                pcVar7 = pcVar1;
              }
            }
            else if (lVar11 == 2) {
LAB_00713149:
              pcVar7 = pcVar10;
              if ((byte)(*pcVar10 + 0xbfU) < 0x1a) {
                pcVar10 = pcVar10 + 1;
                goto LAB_00713156;
              }
            }
            else {
              pcVar7 = pcVar1;
              if ((lVar11 == 3) && (pcVar7 = pcVar10, (byte)(*pcVar10 + 0xbfU) < 0x1a)) {
                pcVar10 = pcVar10 + 1;
                goto LAB_00713149;
              }
            }
LAB_0071317b:
            bVar5 = pcVar7 == pcVar1;
          }
        }
        else {
          bVar5 = false;
        }
        if (local_58 != local_48) {
          operator_delete(local_58);
        }
        if (!bVar5) goto LAB_007132bb;
      }
    }
    bVar5 = true;
    lVar11 = 0;
    local_38 = rhs;
    do {
      if (node->m_isValid == false) {
        this = (InvalidNode *)__cxa_allocate_exception(0x40);
        InvalidNode::InvalidNode(this,&node->m_invalidKey);
        goto LAB_0071331b;
      }
      if (node->m_pNode == (node *)0x0) {
        psVar6 = detail::node_data::empty_scalar_abi_cxx11_();
        iVar8 = (int)psVar6;
      }
      else {
        iVar8 = (int)(((node->m_pNode->m_pRef).
                       super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->m_pData).
                     super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 0x40;
      }
      anon_unknown.dwarf_1b7c400::tolower((anon_unknown_dwarf_1b7c400 *)&local_58,iVar8);
      sVar4 = *(size_t *)((long)&decode::names[0].truename._M_string_length + lVar11);
      if (sVar4 == local_50) {
        if (sVar4 == 0) {
          bVar13 = true;
        }
        else {
          iVar8 = bcmp(*(void **)((long)&decode::names[0].truename._M_dataplus._M_p + lVar11),
                       local_58,sVar4);
          bVar13 = iVar8 == 0;
        }
      }
      else {
        bVar13 = false;
      }
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      if (bVar13) {
        bVar13 = true;
LAB_007132c5:
        *local_38 = bVar13;
        return bVar5;
      }
      if (node->m_isValid == false) {
        this = (InvalidNode *)__cxa_allocate_exception(0x40);
        InvalidNode::InvalidNode(this,&node->m_invalidKey);
        goto LAB_0071331b;
      }
      if (node->m_pNode == (node *)0x0) {
        psVar6 = detail::node_data::empty_scalar_abi_cxx11_();
        iVar8 = (int)psVar6;
      }
      else {
        iVar8 = (int)(((node->m_pNode->m_pRef).
                       super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->m_pData).
                     super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 0x40;
      }
      anon_unknown.dwarf_1b7c400::tolower((anon_unknown_dwarf_1b7c400 *)&local_58,iVar8);
      sVar4 = *(size_t *)((long)&decode::names[0].falsename._M_string_length + lVar11);
      if (sVar4 == local_50) {
        if (sVar4 == 0) {
          bVar13 = true;
        }
        else {
          iVar8 = bcmp(*(void **)((long)&decode::names[0].falsename._M_dataplus._M_p + lVar11),
                       local_58,sVar4);
          bVar13 = iVar8 == 0;
        }
      }
      else {
        bVar13 = false;
      }
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      if (bVar13) {
        bVar13 = false;
        goto LAB_007132c5;
      }
      lVar11 = lVar11 + 0x40;
      bVar5 = lVar11 != 0x100;
    } while (bVar5);
  }
  else {
LAB_007132bb:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool convert<bool>::decode(const Node& node, bool& rhs) {
  if (!node.IsScalar())
    return false;

  // we can't use iostream bool extraction operators as they don't
  // recognize all possible values in the table below (taken from
  // http://yaml.org/type/bool.html)
  static const struct {
    std::string truename, falsename;
  } names[] = {
      {"y", "n"},
      {"yes", "no"},
      {"true", "false"},
      {"on", "off"},
  };

  if (!IsFlexibleCase(node.Scalar()))
    return false;

  for (const auto& name : names) {
    if (name.truename == tolower(node.Scalar())) {
      rhs = true;
      return true;
    }

    if (name.falsename == tolower(node.Scalar())) {
      rhs = false;
      return true;
    }
  }

  return false;
}